

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  uint64_t uVar12;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar13;
  secp256k1_modinv64_signed62 *psVar14;
  int64_t *a;
  long lVar15;
  long lVar16;
  int64_t *a_00;
  long lVar17;
  int64_t *piVar18;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  secp256k1_modinv64_signed62 *a_01;
  long *extraout_RDX_08;
  long lVar19;
  long lVar20;
  secp256k1_modinv64_signed62 *b;
  secp256k1_modinv64_signed62 *psVar21;
  ulong uVar22;
  long lVar23;
  int64_t *piVar24;
  secp256k1_modinv64_signed62 *psVar25;
  secp256k1_modinv64_signed62 *psVar26;
  int64_t *piVar27;
  undefined1 *puVar28;
  secp256k1_modinv64_signed62 *psVar29;
  int64_t *piVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  secp256k1_modinv64_modinfo *psVar34;
  bool bVar35;
  secp256k1_modinv64_signed62 sStack_110;
  secp256k1_modinv64_signed62 sStack_e8;
  secp256k1_modinv64_signed62 *psStack_c0;
  int64_t *piStack_b8;
  secp256k1_modinv64_modinfo *psStack_b0;
  ulong local_a8;
  int64_t *local_a0;
  ulong local_98;
  int64_t *local_90;
  secp256k1_modinv64_modinfo *local_88;
  int64_t *local_80;
  int64_t local_78;
  int64_t local_70;
  int64_t *local_68;
  int64_t local_60;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t *local_38;
  
  lVar17 = d->v[0];
  local_50 = d->v[1];
  local_58 = d->v[2];
  local_60 = d->v[3];
  local_70 = d->v[4];
  lVar16 = e->v[0];
  local_38 = (int64_t *)e->v[1];
  iVar6 = e->v[2];
  local_98 = t->u;
  local_90 = (int64_t *)t->v;
  local_a8 = t->q;
  local_a0 = (int64_t *)t->r;
  local_40 = e->v[3];
  local_78 = e->v[4];
  uVar22 = 5;
  psVar14 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_b0 = (secp256k1_modinv64_modinfo *)0x141eff;
  a = d->v;
  iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,-2);
  psVar21 = e;
  if (iVar4 < 1) {
LAB_001429a4:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429a9;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_001429a9:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429ae;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_001429ae:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429b3;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_001429b3:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429b8;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_001429b8:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429bd;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar34 = modinfo;
LAB_001429bd:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429c2;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_001429c2:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429c7;
    secp256k1_modinv64_update_de_62_cold_1();
    modinfo = psVar34;
LAB_001429c7:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429cc;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_001429cc:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429d1;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001429d1:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429d6;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_001429d6:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429db;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001429db:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429e0;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001429e0:
    a_00 = a;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429e5;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001429e5:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429ea;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001429ea:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429ef;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001429ef:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429f4;
    secp256k1_modinv64_update_de_62_cold_9();
    a = a_00;
LAB_001429f4:
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429f9;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    uVar22 = 5;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141f21;
    a = d->v;
    local_68 = d->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,1);
    if (-1 < iVar4) goto LAB_001429a9;
    uVar22 = 5;
    psVar14 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141f40;
    a = e->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(e,5,&modinfo->modulus,-2);
    if (iVar4 < 1) goto LAB_001429ae;
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    uVar22 = 5;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141f5d;
    a = e->v;
    iVar4 = secp256k1_modinv64_mul_cmp_62(e,5,&modinfo->modulus,1);
    if (-1 < iVar4) goto LAB_001429b3;
    psVar21 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141f83;
    local_80 = e->v;
    local_48 = iVar6;
    iVar6 = secp256k1_modinv64_abs(local_98);
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141f90;
    a = local_90;
    iVar7 = secp256k1_modinv64_abs((int64_t)local_90);
    psVar14 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    if ((long)psVar14 < iVar6) goto LAB_001429b8;
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141fab;
    iVar6 = secp256k1_modinv64_abs(local_a8);
    psStack_b0 = (secp256k1_modinv64_modinfo *)0x141fb8;
    a = local_a0;
    iVar7 = secp256k1_modinv64_abs((int64_t)local_a0);
    psVar14 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    psVar34 = modinfo;
    if ((long)psVar14 < iVar6) goto LAB_001429bd;
    uVar22 = local_98 * lVar17;
    psVar14 = SUB168(SEXT816((long)local_98) * SEXT816(lVar17),8);
    uVar8 = (long)local_90 * lVar16;
    a = SUB168(SEXT816((long)local_90) * SEXT816(lVar16),8);
    d = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    lVar15 = (0x7fffffffffffffff - (long)a) - (long)psVar14;
    if ((SBORROW8(0x7fffffffffffffff - (long)a,(long)psVar14) !=
        SBORROW8(lVar15,(ulong)(~uVar8 < uVar22))) != (long)(lVar15 - (ulong)(~uVar8 < uVar22)) < 0
        && -1 < (long)a) goto LAB_001429f4;
    piVar24 = (int64_t *)(uVar8 + uVar22);
    a = (int64_t *)((long)a + (long)psVar14 + (ulong)CARRY8(uVar8,uVar22));
    uVar9 = local_a8 * lVar17;
    lVar15 = SUB168(SEXT816((long)local_a8) * SEXT816(lVar17),8);
    uVar10 = (long)local_a0 * lVar16;
    lVar16 = SUB168(SEXT816((long)local_a0) * SEXT816(lVar16),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar9);
    lVar17 = (0x7fffffffffffffff - lVar16) - lVar15;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar17,uVar8)) !=
             (long)(lVar17 - uVar8) < 0;
    psVar14 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)(-uVar10 - 1 >> 8),bVar35 && -1 < lVar16);
    if (!bVar35 || -1 >= lVar16) {
      psVar34 = (secp256k1_modinv64_modinfo *)(local_70 >> 0x3f);
      psVar14 = (secp256k1_modinv64_signed62 *)(local_78 >> 0x3f);
      lVar23 = ((ulong)local_90 & (ulong)psVar14) + (local_98 & (ulong)psVar34);
      piVar27 = (int64_t *)(uVar10 + uVar9);
      lVar16 = lVar16 + lVar15 + (ulong)CARRY8(uVar10,uVar9);
      lVar17 = (modinfo->modulus).v[0];
      uVar12 = modinfo->modulus_inv62;
      uVar22 = lVar23 - (uVar12 * (long)piVar24 + lVar23 & 0x3fffffffffffffff);
      piVar11 = (int64_t *)(uVar22 * lVar17);
      a_00 = SUB168(SEXT816((long)uVar22) * SEXT816(lVar17),8);
      local_88 = modinfo;
      if (-1 < (long)a_00) {
        uVar8 = (ulong)((undefined1 *)(-(long)piVar11 - 1U) < piVar24);
        lVar15 = (0x7fffffffffffffff - (long)a_00) - (long)a;
        if ((SBORROW8(0x7fffffffffffffff - (long)a_00,(long)a) != SBORROW8(lVar15,uVar8)) ==
            (long)(lVar15 - uVar8) < 0) goto LAB_001420e6;
LAB_001422a7:
        psStack_b0 = (secp256k1_modinv64_modinfo *)0x1422ac;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_001422ac:
        lVar23 = (-0x8000000000000000 - lVar17) - (ulong)(uVar12 != 0);
        lVar15 = lVar16 - lVar23;
        if ((SBORROW8(lVar16,lVar23) !=
            SBORROW8(lVar15,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar12))) ==
            (long)(lVar15 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar12)) < 0)
        goto LAB_00142136;
LAB_001422ce:
        psStack_b0 = (secp256k1_modinv64_modinfo *)0x1422d3;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar8 = extraout_RAX;
        lVar16 = extraout_RDX;
LAB_001422d3:
        psVar26 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - lVar16) - (ulong)(uVar8 != 0));
        a = (int64_t *)
            (((long)piVar24 - (long)psVar26) -
            (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar8));
        if ((SBORROW8((long)piVar24,(long)psVar26) !=
            SBORROW8((long)piVar24 - (long)psVar26,
                     (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar8))) == (long)a < 0) {
LAB_001421b9:
          uVar9 = uVar12 >> 0x3e | lVar17 << 2;
          bVar35 = CARRY8((ulong)piVar27,uVar8);
          piVar27 = (int64_t *)((long)piVar27 + uVar8);
          piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar35 + lVar16);
          psVar26 = (secp256k1_modinv64_signed62 *)(local_a8 * local_50 + uVar9);
          a = (int64_t *)
              (SUB168(SEXT816((long)local_a8) * SEXT816(local_50),8) + (lVar17 >> 0x3e) +
              (ulong)CARRY8(local_a8 * local_50,uVar9));
          uVar8 = (long)local_a0 * (long)a_00;
          lVar17 = SUB168(SEXT816((long)local_a0) * SEXT816((long)a_00),8);
          if (lVar17 < 0) goto LAB_001422fd;
          uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar26);
          lVar16 = (0x7fffffffffffffff - lVar17) - (long)a;
          modinfo = (secp256k1_modinv64_modinfo *)(lVar16 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar17,(long)a) != SBORROW8(lVar16,uVar9)) !=
              (long)modinfo < 0) goto LAB_00142315;
        }
        else {
LAB_001422f8:
          psStack_b0 = (secp256k1_modinv64_modinfo *)0x1422fd;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar8 = extraout_RAX_00;
          lVar17 = extraout_RDX_00;
LAB_001422fd:
          modinfo = (secp256k1_modinv64_modinfo *)
                    ((-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0));
          if ((SBORROW8((long)a,(long)modinfo) !=
              SBORROW8((long)a - (long)modinfo,
                       (ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
              (long)(((long)a - (long)modinfo) -
                    (ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0) {
LAB_00142315:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x14231a;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00142320;
          }
        }
        bVar35 = CARRY8((ulong)psVar26,uVar8);
        psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar26->v + uVar8);
        a = (int64_t *)((long)a + (ulong)bVar35 + lVar17);
        psVar29 = (secp256k1_modinv64_signed62 *)(local_88->modulus).v[1];
        modinfo = local_88;
        if (psVar29 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00142320;
        piVar11 = (int64_t *)((long)psVar29 * uVar22);
        piVar18 = SUB168(SEXT816((long)psVar29) * SEXT816((long)uVar22),8);
        if ((long)piVar18 < 0) goto LAB_001428ba;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar11 - 1U) < piVar27);
        lVar17 = (0x7fffffffffffffff - (long)piVar18) - (long)piVar24;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar18,(long)piVar24) != SBORROW8(lVar17,uVar8))
            != (long)(lVar17 - uVar8) < 0) goto LAB_001428dc;
LAB_00142253:
        bVar35 = CARRY8((ulong)piVar11,(ulong)piVar27);
        piVar11 = (int64_t *)((long)piVar11 + (long)piVar27);
        piVar18 = (int64_t *)((long)piVar18 + (long)piVar24 + (ulong)bVar35);
        uVar8 = (long)psVar29 * (long)psVar14;
        lVar17 = SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar14),8);
        if (lVar17 < 0) goto LAB_001428e1;
        psVar25 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
        lVar16 = ((long)d - lVar17) - (long)a;
        puVar28 = (undefined1 *)(lVar16 - (ulong)(psVar25 < psVar26));
        if ((SBORROW8((long)d - lVar17,(long)a) != SBORROW8(lVar16,(ulong)(psVar25 < psVar26))) !=
            (long)puVar28 < 0) goto LAB_00142903;
LAB_00142284:
        bVar35 = CARRY8((ulong)psVar26,uVar8);
        psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar26->v + uVar8);
        a = (int64_t *)((long)a + (ulong)bVar35 + lVar17);
        piVar24 = piVar18;
        piVar27 = piVar11;
LAB_00142320:
        piVar18 = local_68;
        uVar8 = (long)piVar24 << 2 | (ulong)piVar27 >> 0x3e;
        a_00 = (int64_t *)(local_98 * local_58 + uVar8);
        psVar29 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)local_98) * SEXT816(local_58),8) + ((long)piVar24 >> 0x3e) +
                  (ulong)CARRY8(local_98 * local_58,uVar8));
        *local_68 = (ulong)piVar27 & 0x3fffffffffffffff;
        uVar8 = (long)local_90 * local_48;
        lVar17 = SUB168(SEXT816((long)local_90) * SEXT816(local_48),8);
        *local_80 = (ulong)psVar26 & 0x3fffffffffffffff;
        if (lVar17 < 0) {
          puVar28 = (undefined1 *)((-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0));
          psVar25 = (secp256k1_modinv64_signed62 *)
                    (((long)psVar29 - (long)puVar28) -
                    (ulong)(a_00 < (secp256k1_modinv64_signed62 *)-uVar8));
          if ((SBORROW8((long)psVar29,(long)puVar28) !=
              SBORROW8((long)psVar29 - (long)puVar28,
                       (ulong)(a_00 < (secp256k1_modinv64_signed62 *)-uVar8))) != (long)psVar25 < 0)
          goto LAB_0014247e;
LAB_0014238e:
          uVar9 = (ulong)psVar26 >> 0x3e | (long)a << 2;
          bVar35 = CARRY8((ulong)a_00,uVar8);
          a_00 = (int64_t *)((long)a_00 + uVar8);
          psVar29 = (secp256k1_modinv64_signed62 *)((long)psVar29->v + (ulong)bVar35 + lVar17);
          puVar28 = (undefined1 *)(local_a8 * local_58 + uVar9);
          psVar25 = (secp256k1_modinv64_signed62 *)
                    (SUB168(SEXT816((long)local_a8) * SEXT816(local_58),8) + ((long)a >> 0x3e) +
                    (ulong)CARRY8(local_a8 * local_58,uVar9));
          uVar8 = (long)local_a0 * local_48;
          lVar17 = SUB168(SEXT816((long)local_a0) * SEXT816(local_48),8);
          if (lVar17 < 0) goto LAB_00142483;
          uVar9 = (ulong)((undefined1 *)(-1 - uVar8) < puVar28);
          lVar16 = ((long)d - lVar17) - (long)psVar25;
          if ((SBORROW8((long)d - lVar17,(long)psVar25) != SBORROW8(lVar16,uVar9)) !=
              (long)(lVar16 - uVar9) < 0) goto LAB_001424a5;
        }
        else {
          psVar25 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
          lVar16 = ((long)d - lVar17) - (long)psVar29;
          puVar28 = (undefined1 *)(lVar16 - (ulong)(psVar25 < a_00));
          if ((SBORROW8((long)d - lVar17,(long)psVar29) != SBORROW8(lVar16,(ulong)(psVar25 < a_00)))
              == (long)puVar28 < 0) goto LAB_0014238e;
LAB_0014247e:
          psStack_b0 = (secp256k1_modinv64_modinfo *)0x142483;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar8 = extraout_RAX_01;
          lVar17 = extraout_RDX_01;
LAB_00142483:
          lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
          lVar16 = (long)psVar25 - lVar15;
          if ((SBORROW8((long)psVar25,lVar15) !=
              SBORROW8(lVar16,(ulong)(puVar28 < (undefined1 *)-uVar8))) !=
              (long)(lVar16 - (ulong)(puVar28 < (undefined1 *)-uVar8)) < 0) {
LAB_001424a5:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x1424aa;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_001424b0;
          }
        }
        bVar35 = CARRY8((ulong)puVar28,uVar8);
        puVar28 = puVar28 + uVar8;
        psVar25 = (secp256k1_modinv64_signed62 *)((long)psVar25->v + (ulong)bVar35 + lVar17);
        piVar11 = (int64_t *)(modinfo->modulus).v[2];
        if (piVar11 == (int64_t *)0x0) goto LAB_001424b0;
        a = (int64_t *)((long)piVar11 * uVar22);
        psVar26 = SUB168(SEXT816((long)piVar11) * SEXT816((long)uVar22),8);
        if ((long)psVar26 < 0) goto LAB_00142908;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a - 1U) < a_00);
        lVar17 = ((long)d - (long)psVar26) - (long)psVar29;
        piVar24 = a_00;
        if ((SBORROW8((long)d - (long)psVar26,(long)psVar29) != SBORROW8(lVar17,uVar8)) !=
            (long)(lVar17 - uVar8) < 0) goto LAB_0014292a;
LAB_00142423:
        bVar35 = CARRY8((ulong)a,(ulong)piVar24);
        a = (int64_t *)((long)a + (long)piVar24);
        psVar26 = (secp256k1_modinv64_signed62 *)
                  ((long)psVar29->v + (ulong)bVar35 + (long)psVar26->v);
        uVar8 = (long)piVar11 * (long)psVar14;
        lVar17 = SUB168(SEXT816((long)piVar11) * SEXT816((long)psVar14),8);
        if (lVar17 < 0) goto LAB_0014292f;
        piVar30 = (int64_t *)(-1 - uVar8);
        lVar16 = ((long)d - lVar17) - (long)psVar25;
        modinfo = (secp256k1_modinv64_modinfo *)(lVar16 - (ulong)(piVar30 < puVar28));
        a_00 = a;
        psVar29 = psVar26;
        if ((SBORROW8((long)d - lVar17,(long)psVar25) != SBORROW8(lVar16,(ulong)(piVar30 < puVar28))
            ) != (long)modinfo < 0) goto LAB_00142951;
LAB_00142454:
        bVar35 = CARRY8((ulong)puVar28,uVar8);
        puVar28 = puVar28 + uVar8;
        psVar25 = (secp256k1_modinv64_signed62 *)((long)psVar25->v + (ulong)bVar35 + lVar17);
LAB_001424b0:
        uVar8 = (long)psVar29 << 2 | (ulong)a_00 >> 0x3e;
        piVar24 = (int64_t *)(local_98 * local_60 + uVar8);
        piVar30 = (int64_t *)
                  (SUB168(SEXT816((long)local_98) * SEXT816(local_60),8) + ((long)psVar29 >> 0x3e) +
                  (ulong)CARRY8(local_98 * local_60,uVar8));
        piVar18[1] = (ulong)a_00 & 0x3fffffffffffffff;
        uVar8 = (long)local_90 * local_40;
        lVar17 = SUB168(SEXT816((long)local_90) * SEXT816(local_40),8);
        local_80[1] = (ulong)puVar28 & 0x3fffffffffffffff;
        if (lVar17 < 0) {
          uVar9 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
          a = (int64_t *)
              (((long)piVar30 - uVar9) - (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar8));
          if ((SBORROW8((long)piVar30,uVar9) !=
              SBORROW8((long)piVar30 - uVar9,
                       (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar8))) != (long)a < 0)
          goto LAB_00142586;
LAB_0014251c:
          uVar10 = (ulong)puVar28 >> 0x3e | (long)psVar25 << 2;
          bVar35 = CARRY8((ulong)piVar24,uVar8);
          piVar24 = (int64_t *)((long)piVar24 + uVar8);
          piVar30 = (int64_t *)((long)piVar30 + (ulong)bVar35 + lVar17);
          uVar9 = local_a8 * local_60 + uVar10;
          a = (int64_t *)
              (SUB168(SEXT816((long)local_a8) * SEXT816(local_60),8) + ((long)psVar25 >> 0x3e) +
              (ulong)CARRY8(local_a8 * local_60,uVar10));
          uVar8 = (long)local_a0 * local_40;
          lVar17 = SUB168(SEXT816((long)local_a0) * SEXT816(local_40),8);
          if (lVar17 < 0) goto LAB_0014258b;
          uVar10 = (ulong)(-uVar8 - 1 < uVar9);
          lVar16 = ((long)d - lVar17) - (long)a;
          bVar35 = SBORROW8((long)d - lVar17,(long)a) != SBORROW8(lVar16,uVar10);
          lVar16 = lVar16 - uVar10;
        }
        else {
          a = (int64_t *)(-1 - uVar8);
          lVar16 = ((long)d - lVar17) - (long)piVar30;
          uVar9 = lVar16 - (ulong)(a < piVar24);
          if ((SBORROW8((long)d - lVar17,(long)piVar30) != SBORROW8(lVar16,(ulong)(a < piVar24))) ==
              (long)uVar9 < 0) goto LAB_0014251c;
LAB_00142586:
          psStack_b0 = (secp256k1_modinv64_modinfo *)0x14258b;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar8 = extraout_RAX_02;
          lVar17 = extraout_RDX_02;
LAB_0014258b:
          lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
          lVar16 = (long)a - lVar15;
          bVar35 = SBORROW8((long)a,lVar15) != SBORROW8(lVar16,(ulong)(uVar9 < -uVar8));
          lVar16 = lVar16 - (ulong)(uVar9 < -uVar8);
        }
        modinfo = (secp256k1_modinv64_modinfo *)0x8000000000000000;
        if (bVar35 != lVar16 < 0) goto LAB_001429cc;
        psVar26 = (secp256k1_modinv64_signed62 *)(uVar9 + uVar8);
        a = (int64_t *)((long)a + (ulong)CARRY8(uVar9,uVar8) + lVar17);
        psVar25 = (secp256k1_modinv64_signed62 *)(local_88->modulus).v[3];
        if (psVar25 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_0014262a;
        piVar11 = (int64_t *)((long)psVar25 * uVar22);
        piVar18 = SUB168(SEXT816((long)psVar25) * SEXT816((long)uVar22),8);
        if ((long)piVar18 < 0) goto LAB_00142956;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar11 - 1U) < piVar24);
        lVar17 = ((long)d - (long)piVar18) - (long)piVar30;
        if ((SBORROW8((long)d - (long)piVar18,(long)piVar30) != SBORROW8(lVar17,uVar8)) !=
            (long)(lVar17 - uVar8) < 0) goto LAB_00142978;
LAB_001425eb:
        bVar35 = CARRY8((ulong)piVar11,(ulong)piVar24);
        piVar11 = (int64_t *)((long)piVar11 + (long)piVar24);
        piVar18 = (int64_t *)((long)piVar18 + (long)piVar30 + (ulong)bVar35);
        uVar8 = (long)psVar25 * (long)psVar14;
        lVar17 = SUB168(SEXT816((long)psVar25) * SEXT816((long)psVar14),8);
        if (lVar17 < 0) goto LAB_0014297d;
        uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar26);
        lVar16 = ((long)d - lVar17) - (long)a;
        piVar30 = piVar18;
        piVar24 = piVar11;
        if ((SBORROW8((long)d - lVar17,(long)a) != SBORROW8(lVar16,uVar9)) ==
            (long)(lVar16 - uVar9) < 0) {
          do {
            bVar35 = CARRY8((ulong)psVar26,uVar8);
            psVar26 = (secp256k1_modinv64_signed62 *)((long)psVar26->v + uVar8);
            a = (int64_t *)((long)a + (ulong)bVar35 + lVar17);
LAB_0014262a:
            a_00 = local_68;
            uVar8 = (long)piVar30 << 2 | (ulong)piVar24 >> 0x3e;
            psVar29 = (secp256k1_modinv64_signed62 *)((ulong)piVar24 & 0x3fffffffffffffff);
            piVar27 = (int64_t *)(local_98 * local_70 + uVar8);
            piVar24 = (int64_t *)
                      (SUB168(SEXT816((long)local_98) * SEXT816(local_70),8) +
                       ((long)piVar30 >> 0x3e) + (ulong)CARRY8(local_98 * local_70,uVar8));
            local_68[2] = (int64_t)psVar29;
            uVar8 = (long)local_90 * local_78;
            lVar17 = SUB168(SEXT816((long)local_90) * SEXT816(local_78),8);
            local_80[2] = (ulong)psVar26 & 0x3fffffffffffffff;
            if (lVar17 < 0) {
              lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
              lVar16 = (long)piVar24 - lVar15;
              psVar25 = (secp256k1_modinv64_signed62 *)
                        (lVar16 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)piVar24,lVar15) !=
                  SBORROW8(lVar16,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                  (long)psVar25 < 0) goto LAB_00142704;
LAB_00142698:
              uVar9 = (ulong)psVar26 >> 0x3e | (long)a << 2;
              bVar35 = CARRY8((ulong)piVar27,uVar8);
              piVar27 = (int64_t *)((long)piVar27 + uVar8);
              piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar35 + lVar17);
              psVar29 = (secp256k1_modinv64_signed62 *)(local_a8 * local_70 + uVar9);
              psVar25 = (secp256k1_modinv64_signed62 *)
                        (SUB168(SEXT816((long)local_a8) * SEXT816(local_70),8) + ((long)a >> 0x3e) +
                        (ulong)CARRY8(local_a8 * local_70,uVar9));
              uVar8 = (long)local_a0 * local_78;
              lVar17 = SUB168(SEXT816((long)local_a0) * SEXT816(local_78),8);
              if (lVar17 < 0) goto LAB_00142709;
              a = (int64_t *)(-1 - uVar8);
              lVar16 = ((long)d - lVar17) - (long)psVar25;
              bVar35 = SBORROW8((long)d - lVar17,(long)psVar25) !=
                       SBORROW8(lVar16,(ulong)(a < psVar29));
              piVar11 = (int64_t *)(lVar16 - (ulong)(a < psVar29));
            }
            else {
              psVar25 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
              lVar16 = ((long)d - lVar17) - (long)piVar24;
              if ((SBORROW8((long)d - lVar17,(long)piVar24) !=
                  SBORROW8(lVar16,(ulong)(psVar25 < piVar27))) ==
                  (long)(lVar16 - (ulong)(psVar25 < piVar27)) < 0) goto LAB_00142698;
LAB_00142704:
              psStack_b0 = (secp256k1_modinv64_modinfo *)0x142709;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar8 = extraout_RAX_03;
              lVar17 = extraout_RDX_03;
LAB_00142709:
              lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
              lVar16 = (long)psVar25 - lVar15;
              bVar35 = SBORROW8((long)psVar25,lVar15) !=
                       SBORROW8(lVar16,(ulong)(psVar29 < (secp256k1_modinv64_signed62 *)-uVar8));
              a = (int64_t *)(lVar16 - (ulong)(psVar29 < (secp256k1_modinv64_signed62 *)-uVar8));
              piVar11 = a;
            }
            modinfo = local_88;
            piVar18 = (int64_t *)0x8000000000000000;
            if (bVar35 != (long)piVar11 < 0) goto LAB_001429d1;
            piVar11 = (int64_t *)((long)psVar29->v + uVar8);
            psVar29 = (secp256k1_modinv64_signed62 *)
                      ((long)psVar25->v + (ulong)CARRY8((ulong)psVar29,uVar8) + lVar17);
            psVar26 = (secp256k1_modinv64_signed62 *)(local_88->modulus).v[4];
            a = (int64_t *)((long)psVar26 * uVar22);
            uVar22 = SUB168(SEXT816((long)psVar26) * SEXT816((long)uVar22),8);
            if ((long)uVar22 < 0) {
              lVar16 = (-0x8000000000000000 - uVar22) - (ulong)(a != (int64_t *)0x0);
              lVar17 = (long)piVar24 - lVar16;
              if ((SBORROW8((long)piVar24,lVar16) !=
                  SBORROW8(lVar17,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)a))) !=
                  (long)(lVar17 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)a)) < 0)
              goto LAB_00142895;
LAB_00142764:
              bVar35 = CARRY8((ulong)a,(ulong)piVar27);
              a = (int64_t *)((long)a + (long)piVar27);
              uVar22 = (long)piVar24 + bVar35 + uVar22;
              uVar8 = (long)psVar26 * (long)psVar14;
              lVar17 = SUB168(SEXT816((long)psVar26) * SEXT816((long)psVar14),8);
              if (lVar17 < 0) goto LAB_0014289a;
              psVar14 = (secp256k1_modinv64_signed62 *)(-uVar8 - 1);
              lVar16 = (long)d - lVar17;
              lVar15 = lVar16 - (long)psVar29;
              d = (secp256k1_modinv64_signed62 *)(lVar15 - (ulong)(psVar14 < piVar11));
              if ((SBORROW8(lVar16,(long)psVar29) != SBORROW8(lVar15,(ulong)(psVar14 < piVar11))) ==
                  (long)d < 0) goto LAB_00142792;
            }
            else {
              uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)a - 1U) < piVar27);
              lVar17 = ((long)d - uVar22) - (long)piVar24;
              if ((SBORROW8((long)d - uVar22,(long)piVar24) != SBORROW8(lVar17,uVar8)) ==
                  (long)(lVar17 - uVar8) < 0) goto LAB_00142764;
LAB_00142895:
              psStack_b0 = (secp256k1_modinv64_modinfo *)0x14289a;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar8 = extraout_RAX_04;
              lVar17 = extraout_RDX_04;
LAB_0014289a:
              piVar24 = (int64_t *)((-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0));
              psVar14 = (secp256k1_modinv64_signed62 *)
                        (((long)psVar29 - (long)piVar24) -
                        (ulong)(piVar11 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)psVar29,(long)piVar24) !=
                  SBORROW8((long)psVar29 - (long)piVar24,
                           (ulong)(piVar11 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                  (long)psVar14 < 0) {
LAB_00142792:
                d = (secp256k1_modinv64_signed62 *)local_80;
                lVar17 = (long)psVar29->v + (ulong)CARRY8(uVar8,(ulong)piVar11) + lVar17;
                psVar14 = (secp256k1_modinv64_signed62 *)(uVar22 << 2 | (ulong)a >> 0x3e);
                a_00[3] = (ulong)a & 0x3fffffffffffffff;
                psVar21 = (secp256k1_modinv64_signed62 *)
                          (uVar8 + (long)piVar11 & 0x3fffffffffffffff);
                local_80[3] = (int64_t)psVar21;
                a = psVar14[0x333333333333332].v + 4;
                uVar22 = ((long)uVar22 >> 0x3e) + -1 +
                         (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar14);
                if (uVar22 != 0xffffffffffffffff) goto LAB_001429d6;
                uVar22 = 0xffffffffffffffff;
                uVar8 = uVar8 + (long)piVar11 >> 0x3e | lVar17 * 4;
                a_00[4] = (int64_t)psVar14;
                if ((lVar17 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1)
                goto LAB_001429db;
                local_80[4] = uVar8;
                uVar22 = 5;
                psVar14 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b0 = (secp256k1_modinv64_modinfo *)0x14280a;
                a = a_00;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,-2);
                if (iVar4 < 1) goto LAB_001429e0;
                psVar14 = (secp256k1_modinv64_signed62 *)0x1;
                uVar22 = 5;
                psStack_b0 = (secp256k1_modinv64_modinfo *)0x142827;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,1);
                if (-1 < iVar4) goto LAB_001429e5;
                uVar22 = 5;
                psVar14 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_b0 = (secp256k1_modinv64_modinfo *)0x142846;
                a_00 = d->v;
                iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,-2);
                if (iVar4 < 1) goto LAB_001429ea;
                psVar14 = (secp256k1_modinv64_signed62 *)0x1;
                uVar22 = 5;
                psStack_b0 = (secp256k1_modinv64_modinfo *)0x142863;
                a_00 = d->v;
                iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_001429ef;
              }
            }
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x1428ba;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_001428ba:
            lVar16 = (-0x8000000000000000 - (long)piVar18) - (ulong)(piVar11 != (int64_t *)0x0);
            lVar17 = (long)piVar24 - lVar16;
            if ((SBORROW8((long)piVar24,lVar16) !=
                SBORROW8(lVar17,(ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)piVar11)))
                == (long)(lVar17 - (ulong)(piVar27 < (secp256k1_modinv64_signed62 *)-(long)piVar11))
                   < 0) goto LAB_00142253;
LAB_001428dc:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x1428e1;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar8 = extraout_RAX_05;
            lVar17 = extraout_RDX_05;
LAB_001428e1:
            puVar28 = (undefined1 *)((-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0));
            psVar25 = (secp256k1_modinv64_signed62 *)
                      (((long)a - (long)puVar28) -
                      (ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8));
            if ((SBORROW8((long)a,(long)puVar28) !=
                SBORROW8((long)a - (long)puVar28,
                         (ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                (long)psVar25 < 0) goto LAB_00142284;
LAB_00142903:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x142908;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00142908:
            lVar16 = (-0x8000000000000000 - (long)psVar26) - (ulong)(a != (int64_t *)0x0);
            lVar17 = (long)psVar29 - lVar16;
            piVar24 = a_00;
            if ((SBORROW8((long)psVar29,lVar16) !=
                SBORROW8(lVar17,(ulong)(a_00 < (secp256k1_modinv64_signed62 *)-(long)a))) ==
                (long)(lVar17 - (ulong)(a_00 < (secp256k1_modinv64_signed62 *)-(long)a)) < 0)
            goto LAB_00142423;
LAB_0014292a:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x14292f;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar8 = extraout_RAX_06;
            lVar17 = extraout_RDX_06;
            piVar24 = a_00;
LAB_0014292f:
            modinfo = (secp256k1_modinv64_modinfo *)
                      ((-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0));
            piVar30 = (int64_t *)
                      (((long)psVar25 - (long)modinfo) - (ulong)(puVar28 < (undefined1 *)-uVar8));
            a_00 = a;
            psVar29 = psVar26;
            if ((SBORROW8((long)psVar25,(long)modinfo) !=
                SBORROW8((long)psVar25 - (long)modinfo,(ulong)(puVar28 < (undefined1 *)-uVar8))) ==
                (long)piVar30 < 0) goto LAB_00142454;
LAB_00142951:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x142956;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_00142956:
            lVar16 = (-0x8000000000000000 - (long)piVar18) - (ulong)(piVar11 != (int64_t *)0x0);
            lVar17 = (long)piVar30 - lVar16;
            if ((SBORROW8((long)piVar30,lVar16) !=
                SBORROW8(lVar17,(ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar11)))
                == (long)(lVar17 - (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar11))
                   < 0) goto LAB_001425eb;
LAB_00142978:
            psStack_b0 = (secp256k1_modinv64_modinfo *)0x14297d;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar8 = extraout_RAX_07;
            lVar17 = extraout_RDX_07;
LAB_0014297d:
            lVar15 = (-0x8000000000000000 - lVar17) - (ulong)(uVar8 != 0);
            lVar16 = (long)a - lVar15;
            piVar30 = piVar18;
            piVar24 = piVar11;
            if ((SBORROW8((long)a,lVar15) !=
                SBORROW8(lVar16,(ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                (long)(lVar16 - (ulong)(psVar26 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0)
            break;
          } while( true );
        }
        psStack_b0 = (secp256k1_modinv64_modinfo *)0x1429a4;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_001429a4;
      }
      lVar23 = (-0x8000000000000000 - (long)a_00) - (ulong)(piVar11 != (int64_t *)0x0);
      lVar15 = (long)a - lVar23;
      if ((SBORROW8((long)a,lVar23) !=
          SBORROW8(lVar15,(ulong)(piVar24 < (undefined1 *)-(long)piVar11))) !=
          (long)(lVar15 - (ulong)(piVar24 < (undefined1 *)-(long)piVar11)) < 0) goto LAB_001422a7;
LAB_001420e6:
      psVar34 = (secp256k1_modinv64_modinfo *)((ulong)psVar34 & local_a8);
      psVar14 = (secp256k1_modinv64_signed62 *)
                ((long)psVar34 +
                (((ulong)psVar14 & (ulong)local_a0) -
                ((long)(psVar34->modulus).v +
                 uVar12 * (long)piVar27 + ((ulong)psVar14 & (ulong)local_a0) & 0x3fffffffffffffff)))
      ;
      bVar35 = CARRY8((ulong)piVar11,(ulong)piVar24);
      piVar11 = (int64_t *)((long)piVar11 + (long)piVar24);
      a_00 = (int64_t *)((long)a_00 + (long)a + (ulong)bVar35);
      uVar12 = (long)psVar14 * lVar17;
      lVar17 = SUB168(SEXT816((long)psVar14) * SEXT816(lVar17),8);
      if (lVar17 < 0) goto LAB_001422ac;
      uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar12 - 1) < piVar27);
      lVar15 = (0x7fffffffffffffff - lVar17) - lVar16;
      if ((SBORROW8(0x7fffffffffffffff - lVar17,lVar16) != SBORROW8(lVar15,uVar8)) !=
          (long)(lVar15 - uVar8) < 0) goto LAB_001422ce;
LAB_00142136:
      bVar35 = CARRY8(uVar12,(ulong)piVar27);
      uVar12 = uVar12 + (long)piVar27;
      lVar17 = lVar17 + lVar16 + (ulong)bVar35;
      if (((ulong)piVar11 & 0x3fffffffffffffff) != 0) goto LAB_001429c2;
      modinfo = psVar34;
      if ((uVar12 & 0x3fffffffffffffff) == 0) {
        uVar8 = (ulong)piVar11 >> 0x3e | (long)a_00 << 2;
        piVar27 = (int64_t *)(local_98 * local_50 + uVar8);
        piVar24 = (int64_t *)
                  (SUB168(SEXT816((long)local_98) * SEXT816(local_50),8) + ((long)a_00 >> 0x3e) +
                  (ulong)CARRY8(local_98 * local_50,uVar8));
        uVar8 = (long)local_90 * (long)local_38;
        lVar16 = SUB168(SEXT816((long)local_90) * SEXT816((long)local_38),8);
        a_00 = local_38;
        if (lVar16 < 0) goto LAB_001422d3;
        a = (int64_t *)(-1 - uVar8);
        lVar15 = (0x7fffffffffffffff - lVar16) - (long)piVar24;
        psVar26 = (secp256k1_modinv64_signed62 *)(lVar15 - (ulong)(a < piVar27));
        if ((SBORROW8(0x7fffffffffffffff - lVar16,(long)piVar24) !=
            SBORROW8(lVar15,(ulong)(a < piVar27))) != (long)psVar26 < 0) goto LAB_001422f8;
        goto LAB_001421b9;
      }
      goto LAB_001429c7;
    }
  }
  iVar4 = (int)uVar22;
  psStack_b0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar26 = &sStack_110;
  psStack_c0 = psVar21;
  piStack_b8 = d->v;
  psStack_b0 = modinfo;
  secp256k1_modinv64_mul_62(&sStack_e8,(secp256k1_modinv64_signed62 *)a,iVar4,1);
  psVar21 = a_01;
  secp256k1_modinv64_mul_62(&sStack_110,a_01,5,(int64_t)psVar14);
  lVar17 = 0;
  while ((ulong)sStack_e8.v[lVar17] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_110.v[lVar17]) goto LAB_00142a8e;
    lVar17 = lVar17 + 1;
    if (lVar17 == 4) {
      uVar5 = 4;
      while( true ) {
        if (sStack_e8.v[uVar5] < sStack_110.v[uVar5]) {
          return;
        }
        if (sStack_110.v[uVar5] < sStack_e8.v[uVar5]) break;
        bVar35 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar35) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142a8e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar26;
  if (iVar4 < 1) {
LAB_00142d3b:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00142d40:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00142d45:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00142d4a:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00142d4f:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00142d54:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar17 = psVar14->v[0];
    lVar16 = psVar14->v[1];
    lVar15 = psVar21->v[0];
    lVar23 = *extraout_RDX_08;
    uVar22 = lVar15 * lVar17;
    lVar19 = SUB168(SEXT816(lVar15) * SEXT816(lVar17),8);
    uVar8 = lVar23 * lVar16;
    lVar20 = SUB168(SEXT816(lVar23) * SEXT816(lVar16),8);
    lVar2 = (0x7fffffffffffffff - lVar20) - lVar19;
    if ((SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar2,(ulong)(~uVar8 < uVar22)))
        != (long)(lVar2 - (ulong)(~uVar8 < uVar22)) < 0 && -1 < lVar20) goto LAB_00142d54;
    lVar2 = psVar14->v[2];
    lVar1 = psVar14->v[3];
    lVar20 = lVar20 + lVar19 + (ulong)CARRY8(uVar8,uVar22);
    uVar10 = lVar15 * lVar2;
    lVar19 = SUB168(SEXT816(lVar15) * SEXT816(lVar2),8);
    uVar13 = lVar23 * lVar1;
    lVar23 = SUB168(SEXT816(lVar23) * SEXT816(lVar1),8);
    uVar9 = (ulong)(-uVar13 - 1 < uVar10);
    lVar15 = (0x7fffffffffffffff - lVar23) - lVar19;
    if ((SBORROW8(0x7fffffffffffffff - lVar23,lVar19) != SBORROW8(lVar15,uVar9)) ==
        (long)(lVar15 - uVar9) < 0 || lVar23 < 0) {
      lVar15 = lVar23 + lVar19 + (ulong)CARRY8(uVar13,uVar10);
      if ((uVar8 + uVar22 & 0x3fffffffffffffff) != 0) goto LAB_00142d40;
      if ((uVar13 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_00142d45;
      uVar9 = uVar13 + uVar10 >> 0x3e | lVar15 * 4;
      uVar22 = uVar8 + uVar22 >> 0x3e | lVar20 * 4;
      lVar15 = lVar15 >> 0x3e;
      lVar20 = lVar20 >> 0x3e;
      if (iVar4 != 1) {
        psVar26 = (secp256k1_modinv64_signed62 *)((ulong)psVar26 & 0xffffffff);
        psVar14 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar23 = psVar21->v[(long)psVar14];
          uVar10 = lVar23 * lVar17 + uVar22;
          lVar31 = SUB168(SEXT816(lVar23) * SEXT816(lVar17),8) + lVar20 +
                   (ulong)CARRY8(lVar23 * lVar17,uVar22);
          lVar19 = extraout_RDX_08[(long)psVar14];
          uVar8 = lVar19 * lVar16;
          lVar20 = SUB168(SEXT816(lVar19) * SEXT816(lVar16),8);
          if (lVar20 < 0) {
            lVar32 = (-0x8000000000000000 - lVar20) - (ulong)(uVar8 != 0);
            lVar3 = lVar31 - lVar32;
            if ((SBORROW8(lVar31,lVar32) != SBORROW8(lVar3,(ulong)(uVar10 < -uVar8))) ==
                (long)(lVar3 - (ulong)(uVar10 < -uVar8)) < 0) goto LAB_00142c2a;
LAB_00142d31:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00142d36:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00142d3b;
          }
          uVar22 = (ulong)(-uVar8 - 1 < uVar10);
          lVar3 = (0x7fffffffffffffff - lVar20) - lVar31;
          if ((SBORROW8(0x7fffffffffffffff - lVar20,lVar31) != SBORROW8(lVar3,uVar22)) !=
              (long)(lVar3 - uVar22) < 0) goto LAB_00142d31;
LAB_00142c2a:
          lVar20 = lVar31 + lVar20 + (ulong)CARRY8(uVar10,uVar8);
          uVar33 = lVar23 * lVar2 + uVar9;
          lVar23 = SUB168(SEXT816(lVar23) * SEXT816(lVar2),8) + lVar15 +
                   (ulong)CARRY8(lVar23 * lVar2,uVar9);
          uVar13 = lVar19 * lVar1;
          lVar15 = SUB168(SEXT816(lVar19) * SEXT816(lVar1),8);
          if (lVar15 < 0) {
            lVar31 = (-0x8000000000000000 - lVar15) - (ulong)(uVar13 != 0);
            lVar19 = lVar23 - lVar31;
            if ((SBORROW8(lVar23,lVar31) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar13))) !=
                (long)(lVar19 - (ulong)(uVar33 < -uVar13)) < 0) goto LAB_00142d36;
          }
          else {
            uVar22 = (ulong)(-uVar13 - 1 < uVar33);
            lVar19 = (0x7fffffffffffffff - lVar15) - lVar23;
            if ((SBORROW8(0x7fffffffffffffff - lVar15,lVar23) != SBORROW8(lVar19,uVar22)) !=
                (long)(lVar19 - uVar22) < 0) goto LAB_00142d36;
          }
          lVar15 = lVar23 + lVar15 + (ulong)CARRY8(uVar33,uVar13);
          uVar22 = lVar20 * 4 | uVar10 + uVar8 >> 0x3e;
          psVar21->v[(long)((long)psVar14[-1].v + 0x27)] = uVar10 + uVar8 & 0x3fffffffffffffff;
          uVar9 = lVar15 * 4 | uVar33 + uVar13 >> 0x3e;
          extraout_RDX_08[(long)((long)psVar14[-1].v + 0x27)] = uVar33 + uVar13 & 0x3fffffffffffffff
          ;
          psVar14 = (secp256k1_modinv64_signed62 *)((long)psVar14->v + 1);
          lVar15 = lVar15 >> 0x3e;
          lVar20 = lVar20 >> 0x3e;
        } while (psVar26 != psVar14);
      }
      if (lVar20 + -1 + (ulong)(0x7fffffffffffffff < uVar22) != -1) goto LAB_00142d4a;
      psVar21->v[(long)iVar4 + -1] = uVar22;
      if (lVar15 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_08[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_00142d4f;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar17 = psVar26->v[0];
  lVar16 = psVar26->v[1];
  lVar15 = psVar26->v[2];
  lVar23 = psVar26->v[3];
  lVar2 = psVar26->v[4];
  lVar19 = 0;
  do {
    if (psVar26->v[lVar19] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00142f8a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00142f8f;
    }
    if (0x3fffffffffffffff < psVar26->v[lVar19]) goto LAB_00142f8a;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar26,5,b,-2);
  if (iVar4 < 1) {
LAB_00142f8f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00142f94:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142f99:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar26,5,b,1);
    if (-1 < iVar4) goto LAB_00142f94;
    uVar22 = lVar2 >> 0x3f;
    uVar10 = (long)psVar21 >> 0x3f;
    uVar8 = ((uVar22 & b->v[0]) + lVar17 ^ uVar10) - uVar10;
    uVar13 = ((long)uVar8 >> 0x3e) + (((uVar22 & b->v[1]) + lVar16 ^ uVar10) - uVar10);
    uVar33 = ((long)uVar13 >> 0x3e) + ((lVar15 + (uVar22 & b->v[2]) ^ uVar10) - uVar10);
    uVar9 = ((long)uVar33 >> 0x3e) + (((uVar22 & b->v[3]) + lVar23 ^ uVar10) - uVar10);
    lVar17 = ((long)uVar9 >> 0x3e) + (((uVar22 & b->v[4]) + lVar2 ^ uVar10) - uVar10);
    uVar10 = lVar17 >> 0x3f;
    uVar22 = (b->v[0] & uVar10) + (uVar8 & 0x3fffffffffffffff);
    uVar13 = ((long)uVar22 >> 0x3e) + (b->v[1] & uVar10) + (uVar13 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar13 >> 0x3e) + (b->v[2] & uVar10) + (uVar33 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (b->v[3] & uVar10) + (uVar9 & 0x3fffffffffffffff);
    uVar10 = (b->v[4] & uVar10) + lVar17 + ((long)uVar9 >> 0x3e);
    psVar26->v[0] = uVar22 & 0x3fffffffffffffff;
    psVar26->v[1] = uVar13 & 0x3fffffffffffffff;
    psVar26->v[2] = uVar8 & 0x3fffffffffffffff;
    psVar26->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar26->v[4] = uVar10;
    if (0x3fffffffffffffff < uVar10) goto LAB_00142f99;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar26,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar26,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00142fa3;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00142fa3:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}